

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

bool libcellml::isErrorRelatedToComponent(IssuePtr *error,ComponentPtr *component)

{
  CellmlElementType CVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  element_type *peVar3;
  ComponentPtr parent;
  ParentedEntityConstPtr local_68;
  AnyCellmlElement local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  AnyCellmlElementImpl *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  Issue::item((error->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  CVar1 = AnyCellmlElement::type
                    ((AnyCellmlElement *)
                     local_68.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (local_68.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (CVar1 == VARIABLE) {
    Issue::item((error->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    AnyCellmlElement::variable(&local_58);
    local_48 = local_58.mPimpl;
    p_Stack_40 = p_Stack_50;
    local_58.mPimpl = (AnyCellmlElementImpl *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    owningComponent(&local_68);
  }
  else {
    if (CVar1 != RESET) {
      if (CVar1 != COMPONENT) {
        return false;
      }
      Issue::item((error->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      AnyCellmlElement::component((AnyCellmlElement *)&local_68);
      peVar2 = (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this._M_pi = p_Stack_40;
      peVar3 = (element_type *)
               local_68.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (local_68.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        this._M_pi = p_Stack_40;
      }
      goto LAB_0021dd7f;
    }
    Issue::item((error->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    AnyCellmlElement::reset(&local_58);
    local_48 = local_58.mPimpl;
    p_Stack_40 = p_Stack_50;
    local_58.mPimpl = (AnyCellmlElementImpl *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    owningComponent(&local_68);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  peVar2 = (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this._M_pi = local_68.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  peVar3 = (element_type *)
           local_68.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
LAB_0021dd7f:
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  if (peVar2 != peVar3) {
    return false;
  }
  return true;
}

Assistant:

bool isErrorRelatedToComponent(const IssuePtr &error, const ComponentPtr &component)
{
    auto errorType = error->item()->type();
    if (errorType == CellmlElementType::COMPONENT) {
        if (component == error->item()->component()) {
            return true;
        }
    } else if (errorType == CellmlElementType::VARIABLE) {
        auto parent = owningComponent(error->item()->variable());
        if (component == parent) {
            return true;
        }
    } else if (errorType == CellmlElementType::RESET) {
        auto parent = owningComponent(error->item()->reset());
        if (component == parent) {
            return true;
        }
    }

    return false;
}